

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O3

QNetworkRequest __thiscall
QNetworkAccessManagerPrivate::prepareMultipart
          (QNetworkAccessManagerPrivate *this,QNetworkRequest *request,QHttpMultiPart *multiPart)

{
  int iVar1;
  long *plVar2;
  QAnyStringView value;
  bool bVar3;
  char cVar4;
  long in_RCX;
  storage_type *psVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QAnyStringView value_00;
  QHttpHeaders h;
  QByteArray local_68;
  QNetworkRequest local_48;
  QStringBuilder<QStringBuilder<const_char_(&)[13],_QByteArray_&>,_char> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)this = &DAT_aaaaaaaaaaaaaaaa;
  QNetworkRequest::QNetworkRequest((QNetworkRequest *)this,(QNetworkRequest *)multiPart);
  local_48.d.d.ptr = (QSharedDataPointer<QNetworkRequestPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkRequest::headers(&local_48);
  bVar3 = QHttpHeaders::contains((QHttpHeaders *)&local_48,ContentType);
  if (!bVar3) {
    local_68.d.d = (Data *)0x0;
    local_68.d.ptr = (char *)0x0;
    local_68.d.size = 0;
    QByteArray::reallocData
              ((longlong)&local_68,(int)*(undefined8 *)(*(long *)(in_RCX + 8) + 0xa0) + 0x22);
    if ((&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) &&
       (*(qsizetype *)((long)local_68.d.d + 8) != 0)) {
      *(byte *)&(((ArrayOptions *)((long)local_68.d.d + 4))->
                super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(((ArrayOptions *)((long)local_68.d.d + 4))->
                 super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
    QVar6.m_data = (storage_type *)0xa;
    QVar6.m_size = local_68.d.size;
    QByteArray::insert((longlong)&local_68,QVar6);
    iVar1 = *(int *)(*(long *)(in_RCX + 8) + 0xa8);
    if (iVar1 == 3) {
      psVar5 = (storage_type *)0xb;
    }
    else if (iVar1 == 2) {
      psVar5 = (storage_type *)0x9;
    }
    else if (iVar1 == 1) {
      psVar5 = (storage_type *)0x7;
    }
    else {
      psVar5 = (storage_type *)0x5;
    }
    QVar7.m_data = psVar5;
    QVar7.m_size = local_68.d.size;
    QByteArray::insert((longlong)&local_68,QVar7);
    local_40.a.b = (QByteArray *)(*(long *)(in_RCX + 8) + 0x90);
    local_40.a.a = (char (*) [13])0x259fba;
    local_40.b = '\"';
    QtStringBuilder::appendToByteArray<QStringBuilder<char_const(&)[13],QByteArray&>,char>
              (&local_68,&local_40,'\0');
    value.m_size = local_68.d.size;
    value.field_0.m_data_utf8 = local_68.d.ptr;
    QHttpHeaders::append((QHttpHeaders *)&local_48,ContentType,value);
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  bVar3 = QHttpHeaders::contains((QHttpHeaders *)&local_48,MIMEVersion);
  if (!bVar3) {
    value_00.m_size = 3;
    value_00.field_0.m_data_utf8 = "1.0";
    QHttpHeaders::append((QHttpHeaders *)&local_48,MIMEVersion,value_00);
  }
  QNetworkRequest::setHeaders((QNetworkRequest *)this,(QHttpHeaders *)&local_48);
  plVar2 = *(long **)(*(long *)(in_RCX + 8) + 0xb0);
  cVar4 = QIODevice::isReadable();
  if (cVar4 == '\0') {
    cVar4 = QIODevice::isOpen();
    if (cVar4 == '\0') {
      cVar4 = (**(code **)(*plVar2 + 0x68))(plVar2,1);
      if (cVar4 == '\0') {
        prepareMultipart();
      }
    }
    else {
      prepareMultipart();
    }
  }
  QHttpHeaders::~QHttpHeaders((QHttpHeaders *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QSharedDataPointer<QNetworkRequestPrivate>)
           (QSharedDataPointer<QNetworkRequestPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkRequest QNetworkAccessManagerPrivate::prepareMultipart(const QNetworkRequest &request, QHttpMultiPart *multiPart)
{
    // copy the request, we probably need to add some headers
    QNetworkRequest newRequest(request);
    auto h = newRequest.headers();

    // add Content-Type header if not there already
    if (!h.contains(QHttpHeaders::WellKnownHeader::ContentType)) {
        QByteArray contentType;
        contentType.reserve(34 + multiPart->d_func()->boundary.size());
        contentType += "multipart/";
        switch (multiPart->d_func()->contentType) {
        case QHttpMultiPart::RelatedType:
            contentType += "related";
            break;
        case QHttpMultiPart::FormDataType:
            contentType += "form-data";
            break;
        case QHttpMultiPart::AlternativeType:
            contentType += "alternative";
            break;
        default:
            contentType += "mixed";
            break;
        }
        // putting the boundary into quotes, recommended in RFC 2046 section 5.1.1
        contentType += "; boundary=\"" + multiPart->d_func()->boundary + '"';
        h.append(QHttpHeaders::WellKnownHeader::ContentType, contentType);
    }

    // add MIME-Version header if not there already (we must include the header
    // if the message conforms to RFC 2045, see section 4 of that RFC)
    if (!h.contains(QHttpHeaders::WellKnownHeader::MIMEVersion))
        h.append(QHttpHeaders::WellKnownHeader::MIMEVersion, "1.0"_ba);

    newRequest.setHeaders(std::move(h));

    QIODevice *device = multiPart->d_func()->device;
    if (!device->isReadable()) {
        if (!device->isOpen()) {
            if (!device->open(QIODevice::ReadOnly))
                qWarning("could not open device for reading");
        } else {
            qWarning("device is not readable");
        }
    }

    return newRequest;
}